

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManMappingVerify(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  if (p->vMapping != (Vec_Int_t *)0x0) {
    Gia_ManIncrementTravId(p);
    iVar4 = 0;
    if (p->nBufs == 0) {
      iVar4 = p->nObjs;
    }
    while ((iVar4 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar4), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar2 = (uint)*(undefined8 *)pGVar3;
      if ((-1 < (int)uVar2) &&
         (((uVar2 & 0x1fffffff) != 0x1fffffff &&
          ((uVar2 & 0x1fffffff) == ((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff))))) {
        pGVar3 = pGVar3 + -(ulong)(uVar2 & 0x1fffffff);
        iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjId(p,pGVar3);
          iVar1 = Gia_ObjIsLut(p,iVar1);
          if (iVar1 == 0) {
            uVar2 = Gia_ObjId(p,pGVar3);
            Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n",(ulong)uVar2)
            ;
          }
          else {
            Gia_ManMappingVerify_rec(p,pGVar3);
          }
        }
      }
      iVar4 = iVar4 + 1;
    }
    iVar4 = 0;
    while ((iVar4 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar4), pGVar3 != (Gia_Obj_t *)0x0))) {
      pGVar3 = pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
      iVar1 = Gia_ObjIsAndNotBuf(pGVar3);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjId(p,pGVar3);
        iVar1 = Gia_ObjIsLut(p,iVar1);
        if (iVar1 == 0) {
          uVar2 = Gia_ObjId(p,pGVar3);
          Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n",(ulong)uVar2);
        }
        else {
          Gia_ManMappingVerify_rec(p,pGVar3);
        }
      }
      iVar4 = iVar4 + 1;
    }
    return;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                ,0x7f6,"void Gia_ManMappingVerify(Gia_Man_t *)");
}

Assistant:

void Gia_ManMappingVerify( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, Result = 1;
    assert( Gia_ManHasMapping(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachBuf( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
//    if ( Result && Gia_NtkIsRoot(p) )
//        Abc_Print( 1, "Mapping verified correctly.\n" );
}